

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O2

void av1_single_motion_search
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int ref_idx,int *rate_mv,
               int search_range,inter_mode_info *mode_info,int_mv *best_mv,HandleInterModeArgs *args
               )

{
  AV1_COMMON *cm;
  undefined8 *puVar1;
  char cVar2;
  MOTION_MODE MVar3;
  uint8_t uVar4;
  byte bVar5;
  BLOCK_SIZE BVar6;
  byte bVar7;
  short sVar8;
  short sVar9;
  ushort uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  byte bVar16;
  int z;
  int iVar17;
  FULLPEL_MV FVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  MV MVar22;
  undefined4 extraout_var;
  int_mv (*paiVar23) [7];
  undefined4 extraout_var_00;
  undefined6 uVar24;
  int iVar25;
  uint uVar26;
  int *piVar27;
  uint uVar28;
  uint uVar29;
  buf_2d *pbVar30;
  ulong uVar31;
  long lVar32;
  MV *subpel_mv;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  MB_MODE_INFO *pMVar36;
  uint uVar37;
  uint uVar38;
  bool bVar39;
  bool bVar40;
  long lVar41;
  MV ref_mv;
  uint local_570;
  int local_568;
  MV this_best_mv_1;
  int cnt;
  MACROBLOCKD *local_558;
  MB_MODE_INFO *local_550;
  ulong local_548;
  int_mv (*local_540) [7];
  ulong local_538;
  int local_530;
  int dis;
  ulong local_528;
  ulong local_520;
  MvCosts *local_518;
  int local_510;
  uint sse;
  undefined8 local_508;
  search_site_config *local_500;
  uint local_4f4;
  ulong local_4f0;
  long local_4e8;
  YV12_BUFFER_CONFIG *local_4e0;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MV this_best_mv;
  int_mv fractional_ms_list [3];
  FULLPEL_MV this_second_best_mv;
  int cost_list [5];
  buf_2d backup_yv12 [3];
  FULLPEL_MV_STATS this_mv_stats;
  SubpelMvLimits local_3a8 [9];
  cand_mv_t cand [65];
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  
  local_508 = CONCAT44(local_508._4_4_,search_range);
  local_558 = &x->e_mbd;
  uVar26 = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
  uVar33 = (ulong)uVar26;
  local_550 = *(x->e_mbd).mi;
  backup_yv12[2].width = 0;
  backup_yv12[2].height = 0;
  backup_yv12[2].stride = 0;
  backup_yv12[2]._28_4_ = 0;
  backup_yv12[2].buf = (uint8_t *)0x0;
  backup_yv12[2].buf0 = (uint8_t *)0x0;
  backup_yv12[1].width = 0;
  backup_yv12[1].height = 0;
  backup_yv12[1].stride = 0;
  backup_yv12[1]._28_4_ = 0;
  backup_yv12[1].buf = (uint8_t *)0x0;
  backup_yv12[1].buf0 = (uint8_t *)0x0;
  backup_yv12[0].width = 0;
  backup_yv12[0].height = 0;
  backup_yv12[0].stride = 0;
  backup_yv12[0]._28_4_ = 0;
  backup_yv12[0].buf = (uint8_t *)0x0;
  backup_yv12[0].buf0 = (uint8_t *)0x0;
  local_4e8 = (long)ref_idx;
  cVar2 = local_550->ref_frame[local_4e8];
  local_4e0 = av1_get_scaled_ref_frame(cpi,(int)cVar2);
  iVar17 = (x->e_mbd).mi_row;
  local_530 = (x->e_mbd).mi_col;
  local_518 = x->mv_costs;
  local_4f0 = uVar33;
  if (local_4e0 != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar30 = backup_yv12;
    for (lVar32 = 0; uVar33 * 0xa30 - lVar32 != 0; lVar32 = lVar32 + 0xa30) {
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4e8].buf + lVar32);
      puVar11 = (uint8_t *)*puVar1;
      puVar12 = (uint8_t *)puVar1[1];
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4e8].width + lVar32);
      uVar13 = *puVar1;
      uVar14 = puVar1[1];
      pbVar30->width = (int)uVar13;
      pbVar30->height = (int)((ulong)uVar13 >> 0x20);
      *(undefined8 *)&pbVar30->stride = uVar14;
      pbVar30->buf = puVar11;
      pbVar30->buf0 = puVar12;
      pbVar30 = pbVar30 + 1;
    }
    av1_setup_pre_planes(local_558,ref_idx,local_4e0,iVar17,local_530,(scale_factors *)0x0,uVar26);
  }
  lVar32 = (long)(int)cVar2;
  local_510 = iVar17;
  if (((cpi->sf).mv_sf.auto_mv_step_size == 0) || ((cpi->common).show_frame == 0)) {
    local_570 = (cpi->mv_search_params).mv_step_param;
  }
  else {
    iVar17 = av1_init_search_range(x->max_mv_context[lVar32]);
    local_570 = (iVar17 + (cpi->mv_search_params).mv_step_param) / 2;
  }
  ref_mv = (MV)av1_get_ref_mv(x,ref_idx);
  MVar3 = local_550->motion_mode;
  if (MVar3 == '\0') {
    subpel_mv = &ref_mv;
  }
  else {
    subpel_mv = (MV *)local_550->mv;
  }
  FVar18 = get_fullmv_from_mv(subpel_mv);
  local_548 = 0;
  memset(cand,0,0x208);
  pMVar36 = local_550;
  cand[0].fmv.as_fullmv = FVar18;
  cnt = 1;
  local_538 = (ulong)bsize;
  local_520 = CONCAT44(local_520._4_4_,FVar18);
  if ((((cpi->sf).mv_sf.full_pixel_search_level == 0) && (MVar3 == '\0')) &&
     ((x->sb_enc).tpl_data_count != 0)) {
    uVar4 = (cpi->ppi->tpl_data).tpl_bsize_1d;
    if (uVar4 == '\x04') {
      lVar41 = 0;
    }
    else if (uVar4 == '\b') {
      lVar41 = 3;
    }
    else {
      lVar41 = 6;
      if (uVar4 != '\x10') {
        if (uVar4 == '@') {
          lVar41 = 0xc;
        }
        else if (uVar4 == ' ') {
          lVar41 = 9;
        }
      }
    }
    bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[lVar41];
    bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[lVar41];
    bVar15 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_538]
             / bVar5;
    if (bVar5 <= "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [local_538] &&
        bVar16 <= "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [local_538]) {
      iVar17 = (x->e_mbd).mi_row;
      BVar6 = ((cpi->common).seq_params)->sb_size;
      bVar7 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar6];
      iVar21 = (x->sb_enc).tpl_stride;
      local_500 = (search_site_config *)CONCAT44(local_500._4_4_,iVar21);
      iVar19 = (int)(short)((short)((x->e_mbd).mi_col %
                                   (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                              [BVar6]) / (short)(ushort)bVar16);
      local_528 = CONCAT44(local_528._4_4_,iVar19);
      uVar35 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [local_538] / bVar16);
      iVar25 = bVar15 * uVar35;
      cand[0].weight = iVar25;
      local_540 = (x->sb_enc).tpl_mv;
      for (uVar26 = 0; local_4f4 = (uint)bVar15, uVar26 < local_4f4; uVar26 = uVar26 + 1) {
        for (uVar33 = 0; local_4f4 = (uint)bVar15, uVar33 < uVar35; uVar33 = uVar33 + 1) {
          iVar20 = (int)uVar33 +
                   (uVar26 + (int)(short)((short)(iVar17 % (int)(uint)bVar7) / (short)(ushort)bVar5)
                   ) * iVar21 + iVar19;
          sVar8 = local_540[(long)iVar20 + -1][lVar32 + 6].as_mv.row;
          sVar9 = *(short *)((long)local_540[(long)iVar20 + -1] + lVar32 * 4 + 0x1a);
          if (CONCAT22(sVar9,sVar8) == -0x7fff8000) {
            local_548 = 0;
            goto LAB_0034ccfc;
          }
          uVar28 = (uint)(-1 < sVar8) + (int)sVar8 + 3;
          uVar37 = (int)sVar9 + (uint)(-1 < sVar9) + 3;
          uVar29 = (int)uVar28 >> 3;
          uVar38 = (int)uVar37 >> 3;
          lVar41 = 1;
          piVar27 = &cand[0].weight;
          while (bVar39 = lVar41 != 0, lVar41 = lVar41 + -1, bVar39) {
            uVar34 = (uint)(((cand_mv_t *)(piVar27 + -1))->fmv).as_mv.row;
            if ((((uVar34 - ((int)~uVar34 >> 0x1f)) + 3 ^ (uVar29 - ((int)~uVar29 >> 0x1f)) + 3) < 8
                ) && ((((int)*(short *)((long)piVar27 + -2) -
                       (~(int)*(short *)((long)piVar27 + -2) >> 0x1f)) + 3U ^
                      (uVar38 - ((int)~uVar38 >> 0x1f)) + 3) < 8)) {
              iVar20 = *piVar27;
              goto LAB_0034ccc2;
            }
            piVar27 = piVar27 + 2;
          }
          cand[1].fmv.as_mv.row = (int16_t)(uVar28 >> 3);
          cand[1].fmv.as_mv.col = (int16_t)(uVar37 >> 3);
          cand[1].weight = 1;
          piVar27 = &cnt;
          iVar20 = cnt;
LAB_0034ccc2:
          *piVar27 = iVar20 + 1;
        }
      }
      local_548 = (ulong)(uint)(iVar25 * 2);
    }
  }
LAB_0034ccfc:
  if (((cpi->sf).mv_sf.skip_fullpel_search_using_startmv != 0) && (local_550->motion_mode == '\0'))
  {
    uVar26 = args->start_mv_cnt;
    lVar41 = 0;
    uVar33 = 0;
    if (0 < (int)uVar26) {
      uVar33 = (ulong)uVar26;
    }
    for (; lVar41 != 1; lVar41 = lVar41 + 1) {
      for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
        uVar28 = (int)args->start_mv_stack[uVar31].row - (int)cand[lVar41].fmv.as_mv.row;
        uVar35 = -uVar28;
        if (0 < (int)uVar28) {
          uVar35 = uVar28;
        }
        uVar29 = (int)args->start_mv_stack[uVar31].col - (int)cand[lVar41].fmv.as_mv.col;
        uVar28 = -uVar29;
        if (0 < (int)uVar29) {
          uVar28 = uVar29;
        }
        if (args->single_newmv_valid[args->ref_mv_idx_stack[uVar31]][lVar32] != 0) {
          uVar28 = uVar28 & 0xffff;
          iVar17 = (cpi->sf).mv_sf.skip_fullpel_search_using_startmv;
          if (iVar17 < 2) {
            if (iVar17 == 1) {
              uVar28 = uVar28 + (uVar35 & 0xffff);
              goto LAB_0034ce8e;
            }
          }
          else if ((uVar35 & 0xffff) < 2) {
LAB_0034ce8e:
            if (uVar28 < 2) {
              cand[lVar41].fmv.as_int = 0x80008000;
              goto LAB_0034ceff;
            }
          }
        }
      }
      if ((*(ushort *)&local_550->field_0xa7 & 0x30) != 0x20) {
        *(int_mv *)(args->start_mv_stack + (int)uVar26) = cand[lVar41].fmv;
        args->ref_mv_idx_stack[args->start_mv_cnt] = (byte)local_550->field_0xa7 >> 4 & 3;
        uVar26 = args->start_mv_cnt + 1;
        args->start_mv_cnt = uVar26;
      }
LAB_0034ceff:
    }
  }
  bVar16 = av1_get_default_mv_search_method(x,&(cpi->sf).mv_sf,bsize);
  local_500 = av1_get_search_site_config(cpi,x,bVar16);
  if ((int)local_508 != 0x7fffffff) {
    bVar5 = ""[bVar16];
    if ((int)local_508 < 1) {
      local_570 = local_500[bVar5].num_search_steps;
    }
    else {
      iVar17 = ~local_570 + local_500[bVar5].num_search_steps;
      local_570 = local_570 - 1;
      do {
        local_570 = local_570 + 1;
        if (local_500[bVar5].radius[iVar17] <= (int)local_508 * 2) break;
        bVar39 = 0 < iVar17;
        iVar17 = iVar17 + -1;
      } while (bVar39);
    }
  }
  best_mv->as_int = 0x80008000;
  local_540 = (int_mv (*) [7])(ulong)bVar16;
  iVar17 = use_fine_search_interval(cpi);
  local_508 = CONCAT44(extraout_var,iVar17);
  MVar3 = pMVar36->motion_mode;
  if (MVar3 == '\x01') {
    FVar18 = local_520._0_4_;
    av1_make_default_fullpel_ms_params
              (&full_ms_params,cpi,x,(BLOCK_SIZE)local_538,&ref_mv,local_520._0_4_,local_500,
               (SEARCH_METHODS)local_540,iVar17);
    local_568 = av1_obmc_full_pixel_search(FVar18,&full_ms_params,local_570,&best_mv->as_fullmv);
    uVar24 = (undefined6)(CONCAT44(extraout_var_00,local_568) >> 0x10);
    local_520 = CONCAT62(uVar24,0x8000);
    local_528 = CONCAT62(uVar24,0x8000);
  }
  else {
    if (MVar3 != '\0') {
      return;
    }
    iVar17 = (int)local_548 * 3;
    local_548 = CONCAT44(local_548._4_4_,iVar17);
    local_568 = 0x7fffffff;
    uVar10 = (ushort)((uint)iVar17 >> 0x10);
    local_520 = CONCAT62((uint6)uVar10,0x8000);
    local_528 = (ulong)CONCAT22(uVar10,0x8000);
    iVar17 = 0;
    paiVar23 = local_540;
    for (lVar41 = 0; pMVar36 = local_550, lVar41 != 1; lVar41 = lVar41 + 1) {
      FVar18 = cand[lVar41].fmv.as_fullmv;
      if (FVar18 != (FULLPEL_MV)0x80008000) {
        av1_make_default_fullpel_ms_params
                  (&full_ms_params,cpi,x,(BLOCK_SIZE)local_538,&ref_mv,FVar18,local_500,
                   (SEARCH_METHODS)paiVar23,(int)local_508);
        if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
          piVar27 = (int *)0x0;
        }
        else {
          piVar27 = cost_list;
          if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
            piVar27 = (int *)0x0;
          }
        }
        iVar21 = av1_full_pixel_search
                           (FVar18,&full_ms_params,local_570,piVar27,&this_best_mv,&this_mv_stats,
                            &this_second_best_mv);
        if (iVar21 < local_568) {
          best_mv->as_fullmv = this_best_mv;
          best_mv_stats.sse = this_mv_stats.sse;
          local_528 = _this_second_best_mv & 0xffffffff;
          local_520 = _this_second_best_mv >> 0x10 & 0xffff;
          local_568 = iVar21;
        }
        iVar17 = iVar17 + cand[lVar41].weight;
        paiVar23 = local_540;
        pMVar36 = local_550;
        if ((int)local_548 < iVar17 * 4) break;
      }
    }
  }
  if (best_mv->as_int == 0x80008000) {
    return;
  }
  if (local_4e0 != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar30 = backup_yv12;
    for (lVar41 = 0; local_4f0 * 0xa30 - lVar41 != 0; lVar41 = lVar41 + 0xa30) {
      puVar11 = pbVar30->buf;
      puVar12 = pbVar30->buf0;
      uVar13 = *(undefined8 *)&pbVar30->stride;
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4e8].width + lVar41);
      *puVar1 = *(undefined8 *)&pbVar30->width;
      puVar1[1] = uVar13;
      puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[local_4e8].buf + lVar41);
      *puVar1 = puVar11;
      puVar1[1] = puVar12;
      pbVar30 = pbVar30 + 1;
    }
  }
  if (((1 < (cpi->sf).inter_sf.skip_newmv_in_drl) && (pMVar36->motion_mode == '\0')) &&
     (best_mv->as_int != 0x80008000)) {
    this_mv_stats.err_cost = (int)get_mv_from_fullmv(&best_mv->as_fullmv);
    uVar33 = (ulong)(*(ushort *)&pMVar36->field_0xa7 >> 4 & 3);
    iVar17 = av1_mv_bit_cost((MV *)&this_mv_stats,&ref_mv,local_518->nmv_joint_cost,
                             local_518->mv_cost_stack,0x6c);
    mode_info[uVar33].full_search_mv.as_int = this_mv_stats.err_cost;
    mode_info[uVar33].full_mv_rate = iVar17;
    mode_info[uVar33].full_mv_bestsme = local_568;
    for (lVar41 = 0; uVar33 * 0x14 - lVar41 != 0; lVar41 = lVar41 + 0x14) {
      if ((this_mv_stats.err_cost == *(int *)((long)&mode_info->full_search_mv + lVar41)) &&
         (*(int *)((long)&mode_info->drl_cost + lVar41) +
          *(int *)((long)&mode_info->full_mv_rate + lVar41) <= mode_info[uVar33].drl_cost + iVar17))
      {
LAB_0034d404:
        best_mv->as_int = 0x80008000;
        return;
      }
      iVar21 = *(int *)((long)&mode_info->full_mv_bestsme + lVar41);
      if ((iVar21 != 0x7fffffff) && (iVar19 = (cpi->sf).inter_sf.skip_newmv_in_drl, 2 < iVar19)) {
        iVar25 = iVar21 >> 2;
        if (iVar19 != 3) {
          iVar25 = 0;
        }
        if ((iVar25 + iVar21 < local_568) &&
           (*(int *)((long)&mode_info->drl_cost + lVar41) < mode_info[uVar33].drl_cost))
        goto LAB_0034d404;
      }
    }
  }
  if ((cpi->common).features.cur_frame_force_integer_mv == true) {
    convert_fullmv_to_mv(best_mv);
  }
  if ((local_568 != 0x7fffffff) && ((cpi->common).features.cur_frame_force_integer_mv == false)) {
    cm = &cpi->common;
    for (lVar41 = 0; lVar41 != 3; lVar41 = lVar41 + 1) {
      fractional_ms_list[lVar41].as_int = 0x80008000;
    }
    av1_make_default_subpel_ms_params
              ((SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,cpi,x,(BLOCK_SIZE)local_538,&ref_mv,
               cost_list);
    MVar22 = get_mv_from_fullmv(&best_mv->as_fullmv);
    if (pMVar36->motion_mode == '\x01') {
      av1_find_best_obmc_sub_pixel_tree_up
                (local_558,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,MVar22,
                 (FULLPEL_MV_STATS *)0x0,&best_mv->as_mv,&dis,x->pred_sse + lVar32,(int_mv *)0x0);
    }
    else if (pMVar36->motion_mode == '\0') {
      if ((cpi->sf).mv_sf.use_accurate_subpel_search == '\0') {
        (*(cpi->mv_search_params).find_fractional_mv_step)
                  (local_558,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,MVar22,&best_mv_stats,
                   (MV *)best_mv,&dis,x->pred_sse + lVar32,(int_mv *)0x0);
      }
      else {
        uVar26 = (uint)(ushort)local_528 | (int)local_520 << 0x10;
        if (uVar26 == 0x80008000) {
          bVar39 = false;
        }
        else if (uVar26 == best_mv->as_int) {
          bVar39 = false;
        }
        else {
          bVar39 = (cpi->sf).mv_sf.disable_second_mv < 2;
        }
        iVar17 = (*(cpi->mv_search_params).find_fractional_mv_step)
                           (local_558,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,MVar22,
                            &best_mv_stats,(MV *)best_mv,&dis,x->pred_sse + lVar32,
                            fractional_ms_list);
        uVar33 = local_538;
        if (bVar39) {
          uVar31 = 0x7fffffffffffffff;
          _this_best_mv = (x->e_mbd).plane[0].dst.buf;
          if ((cpi->sf).mv_sf.disable_second_mv == 0) {
            local_550->mv[0] = *best_mv;
            BVar6 = (BLOCK_SIZE)local_538;
            av1_enc_build_inter_predictor
                      (cm,local_558,local_510,local_530,(BUFFER_SET *)&this_best_mv,BVar6,0,0);
            av1_subtract_plane(x,BVar6,0);
            _this_second_best_mv = 0;
            av1_estimate_txfm_yrd
                      (cpi,x,(RD_STATS *)&this_second_best_mv,0x7fffffffffffffff,BVar6,""[uVar33]);
            iVar21 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_518->nmv_joint_cost,
                                     local_518->mv_cost_stack,0x6c);
            uVar31 = (long)x->rdmult * ((long)iVar21 + (long)(int)this_second_best_mv) + 0x100 >> 9;
          }
          MVar22 = (MV)((int)local_520 * 0x80000 + ((uint)local_528 & 0x1fff) * 8);
          local_540 = (int_mv (*) [7])uVar31;
          iVar21 = av1_is_subpelmv_in_range(local_3a8,MVar22);
          pMVar36 = local_550;
          if (iVar21 != 0) {
            iVar21 = (*(cpi->mv_search_params).find_fractional_mv_step)
                               (local_558,cm,(SUBPEL_MOTION_SEARCH_PARAMS *)&this_mv_stats,MVar22,
                                (FULLPEL_MV_STATS *)0x0,&this_best_mv_1,&dis,&sse,fractional_ms_list
                               );
            uVar33 = local_538;
            if ((cpi->sf).mv_sf.disable_second_mv == 0) {
              local_550->mv[0].as_mv = this_best_mv_1;
              BVar6 = (BLOCK_SIZE)local_538;
              av1_enc_build_inter_predictor
                        (cm,local_558,local_510,local_530,(BUFFER_SET *)&this_best_mv,BVar6,0,0);
              av1_subtract_plane(x,BVar6,0);
              _this_second_best_mv = 0;
              av1_estimate_txfm_yrd
                        (cpi,x,(RD_STATS *)&this_second_best_mv,0x7fffffffffffffff,BVar6,""[uVar33])
              ;
              iVar17 = av1_mv_bit_cost(&this_best_mv_1,&ref_mv,local_518->nmv_joint_cost,
                                       local_518->mv_cost_stack,0x6c);
              lVar41 = (long)x->rdmult * ((long)iVar17 + (long)(int)this_second_best_mv) + 0x100 >>
                       9;
              bVar40 = SBORROW8(lVar41,(long)local_540);
              bVar39 = lVar41 - (long)local_540 < 0;
            }
            else {
              bVar40 = SBORROW4(iVar21,iVar17);
              bVar39 = iVar21 - iVar17 < 0;
            }
            pMVar36 = local_550;
            if (bVar40 != bVar39) {
              best_mv->as_mv = this_best_mv_1;
              x->pred_sse[lVar32] = sse;
            }
          }
        }
      }
    }
    if ((((args != (HandleInterModeArgs *)0x0) && (0 < (cpi->sf).inter_sf.skip_newmv_in_drl)) &&
        (pMVar36->motion_mode == '\0')) && (best_mv->as_int != 0x80008000)) {
      uVar33 = (ulong)(*(ushort *)&pMVar36->field_0xa7 >> 4 & 3);
      iVar17 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_518->nmv_joint_cost,
                               local_518->mv_cost_stack,0x6c);
      lVar32 = lVar32 << 2;
      for (lVar41 = 0; uVar33 * 0x14 - lVar41 != 0; lVar41 = lVar41 + 0x14) {
        if (((*(int *)((long)*args->single_newmv_valid + lVar32) != 0) &&
            (best_mv->as_int == *(uint32_t *)((long)*args->single_newmv + lVar32))) &&
           ((*(int *)((long)&mode_info->skip + lVar41) != 0 ||
            (*(int *)((long)&mode_info->drl_cost + lVar41) +
             *(int *)((long)*args->single_newmv_rate + lVar32) <=
             mode_info[uVar33].drl_cost + iVar17)))) {
          mode_info[uVar33].skip = 1;
          break;
        }
        lVar32 = lVar32 + 0x20;
      }
      goto LAB_0034d219;
    }
  }
  iVar17 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_518->nmv_joint_cost,
                           local_518->mv_cost_stack,0x6c);
LAB_0034d219:
  *rate_mv = iVar17;
  return;
}

Assistant:

void av1_single_motion_search(const AV1_COMP *const cpi, MACROBLOCK *x,
                              BLOCK_SIZE bsize, int ref_idx, int *rate_mv,
                              int search_range, inter_mode_info *mode_info,
                              int_mv *best_mv,
                              struct HandleInterModeArgs *const args) {
  MACROBLOCKD *xd = &x->e_mbd;
  const AV1_COMMON *cm = &cpi->common;
  const MotionVectorSearchParams *mv_search_params = &cpi->mv_search_params;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct buf_2d backup_yv12[MAX_MB_PLANE] = { { 0, 0, 0, 0, 0 } };
  int bestsme = INT_MAX;
  const int ref = mbmi->ref_frame[ref_idx];
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const MvCosts *mv_costs = x->mv_costs;

  if (scaled_ref_frame) {
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // full-pixel motion search code to be used without additional
    // modifications.
    for (int i = 0; i < num_planes; i++) {
      backup_yv12[i] = xd->plane[i].pre[ref_idx];
    }
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Work out the size of the first step in the mv step search.
  // 0 here is maximum length first step. 1 is AOMMAX >> 1 etc.
  int step_param;
  if (cpi->sf.mv_sf.auto_mv_step_size && cm->show_frame) {
    // Take the weighted average of the step_params based on the last frame's
    // max mv magnitude and that based on the best ref mvs of the current
    // block for the given reference.
    step_param = (av1_init_search_range(x->max_mv_context[ref]) +
                  mv_search_params->mv_step_param) /
                 2;
  } else {
    step_param = mv_search_params->mv_step_param;
  }

  const MV ref_mv = av1_get_ref_mv(x, ref_idx).as_mv;
  FULLPEL_MV start_mv;
  if (mbmi->motion_mode != SIMPLE_TRANSLATION)
    start_mv = get_fullmv_from_mv(&mbmi->mv[0].as_mv);
  else
    start_mv = get_fullmv_from_mv(&ref_mv);

  // cand stores start_mv and all possible MVs in a SB.
  cand_mv_t cand[MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB + 1];
  av1_zero(cand);
  cand[0].fmv.as_fullmv = start_mv;
  int cnt = 1;
  int total_weight = 0;

  if (!cpi->sf.mv_sf.full_pixel_search_level &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    get_mv_candidate_from_tpl(cpi, x, bsize, ref, cand, &cnt, &total_weight);
  }

  const int cand_cnt = AOMMIN(2, cnt);
  // TODO(any): Test the speed feature for OBMC_CAUSAL mode.
  if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    const int stack_size = args->start_mv_cnt;
    for (int cand_idx = 0; cand_idx < cand_cnt; cand_idx++) {
      int_mv *fmv_cand = &cand[cand_idx].fmv;
      int skip_cand_mv = 0;

      // Check difference between mvs in the stack and candidate mv.
      for (int stack_idx = 0; stack_idx < stack_size; stack_idx++) {
        const uint8_t this_ref_mv_idx = args->ref_mv_idx_stack[stack_idx];
        const FULLPEL_MV *fmv_stack = &args->start_mv_stack[stack_idx];
        const int this_newmv_valid =
            args->single_newmv_valid[this_ref_mv_idx][ref];
        const int row_diff = abs(fmv_stack->row - fmv_cand->as_fullmv.row);
        const int col_diff = abs(fmv_stack->col - fmv_cand->as_fullmv.col);

        if (!this_newmv_valid) continue;

        if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 2) {
          // Prunes the current start_mv candidate, if the absolute mv
          // difference of both row and column are <= 1.
          if (row_diff <= 1 && col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        } else if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 1) {
          // Prunes the current start_mv candidate, if the sum of the absolute
          // mv difference of row and column is <= 1.
          if (row_diff + col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        }
      }
      if (skip_cand_mv) {
        // Ensure atleast one full-pel motion search is not pruned.
        assert(mbmi->ref_mv_idx != 0);
        // Mark the candidate mv as invalid so that motion search gets skipped.
        cand[cand_idx].fmv.as_int = INVALID_MV;
      } else {
        // Store start_mv candidate and corresponding ref_mv_idx of full-pel
        // search in the mv stack (except last ref_mv_idx).
        if (mbmi->ref_mv_idx != MAX_REF_MV_SEARCH - 1) {
          assert(args->start_mv_cnt < (MAX_REF_MV_SEARCH - 1) * 2);
          args->start_mv_stack[args->start_mv_cnt] = fmv_cand->as_fullmv;
          args->ref_mv_idx_stack[args->start_mv_cnt] = mbmi->ref_mv_idx;
          args->start_mv_cnt++;
        }
      }
    }
  }

  // Hot fix for asan complaints when resize mode is on. When resize mode is on,
  // the stride of the reference frame can be different from indicated by
  // MotionVectorSearchParams::search_site_cfg. When this happens, we need to
  // readjust the stride.
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_site_cfg =
      av1_get_search_site_config(cpi, x, search_method);

  // Further reduce the search range.
  if (search_range < INT_MAX) {
    const search_site_config *search_site_cfg =
        &src_search_site_cfg[search_method_lookup[search_method]];
    // Max step_param is search_site_cfg->num_search_steps.
    if (search_range < 1) {
      step_param = search_site_cfg->num_search_steps;
    } else {
      while (search_site_cfg->radius[search_site_cfg->num_search_steps -
                                     step_param - 1] > (search_range << 1) &&
             search_site_cfg->num_search_steps - step_param - 1 > 0)
        step_param++;
    }
  }

  int cost_list[5];
  FULLPEL_MV_STATS best_mv_stats;
  int_mv second_best_mv;
  best_mv->as_int = second_best_mv.as_int = INVALID_MV;

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;

  switch (mbmi->motion_mode) {
    case SIMPLE_TRANSLATION: {
      // Perform a search with the top 2 candidates
      int sum_weight = 0;
      for (int m = 0; m < cand_cnt; m++) {
        int_mv smv = cand[m].fmv;
        FULLPEL_MV this_best_mv, this_second_best_mv;
        FULLPEL_MV_STATS this_mv_stats;

        if (smv.as_int == INVALID_MV) continue;

        av1_make_default_fullpel_ms_params(
            &full_ms_params, cpi, x, bsize, &ref_mv, smv.as_fullmv,
            src_search_site_cfg, search_method, fine_search_interval);

        const int thissme =
            av1_full_pixel_search(smv.as_fullmv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list), &this_best_mv,
                                  &this_mv_stats, &this_second_best_mv);

        if (thissme < bestsme) {
          bestsme = thissme;
          best_mv->as_fullmv = this_best_mv;
          best_mv_stats = this_mv_stats;
          second_best_mv.as_fullmv = this_second_best_mv;
        }

        sum_weight += cand[m].weight;
        if (4 * sum_weight > 3 * total_weight) break;
      }
    } break;
    case OBMC_CAUSAL:
      av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                         &ref_mv, start_mv, src_search_site_cfg,
                                         search_method, fine_search_interval);

      bestsme = av1_obmc_full_pixel_search(start_mv, &full_ms_params,
                                           step_param, &best_mv->as_fullmv);
      break;
    default: assert(0 && "Invalid motion mode!\n");
  }
  if (best_mv->as_int == INVALID_MV) return;

  if (scaled_ref_frame) {
    // Swap back the original buffers for subpel motion search.
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[ref_idx] = backup_yv12[i];
    }
  }

  // Terminate search with the current ref_idx based on fullpel mv, rate cost,
  // and other know cost.
  if (cpi->sf.inter_sf.skip_newmv_in_drl >= 2 &&
      mbmi->motion_mode == SIMPLE_TRANSLATION &&
      best_mv->as_int != INVALID_MV) {
    int_mv this_mv;
    this_mv.as_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    const int ref_mv_idx = mbmi->ref_mv_idx;
    const int this_mv_rate =
        av1_mv_bit_cost(&this_mv.as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
    mode_info[ref_mv_idx].full_search_mv.as_int = this_mv.as_int;
    mode_info[ref_mv_idx].full_mv_rate = this_mv_rate;
    mode_info[ref_mv_idx].full_mv_bestsme = bestsme;

    for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
      // Check if the motion search result same as previous results
      if (this_mv.as_int == mode_info[prev_ref_idx].full_search_mv.as_int) {
        // Compare the rate cost
        const int prev_rate_cost = mode_info[prev_ref_idx].full_mv_rate +
                                   mode_info[prev_ref_idx].drl_cost;
        const int this_rate_cost =
            this_mv_rate + mode_info[ref_mv_idx].drl_cost;

        if (prev_rate_cost <= this_rate_cost) {
          // If the current rate_cost is worse than the previous rate_cost, then
          // we terminate the search. Since av1_single_motion_search is only
          // called by handle_new_mv in SIMPLE_TRANSLATION mode, we set the
          // best_mv to INVALID mv to signal that we wish to terminate search
          // for the current mode.
          best_mv->as_int = INVALID_MV;
          return;
        }
      }

      // Terminate the evaluation of current ref_mv_idx based on bestsme and
      // drl_cost.
      const int psme = mode_info[prev_ref_idx].full_mv_bestsme;
      if (psme == INT_MAX) continue;
      const int thr =
          cpi->sf.inter_sf.skip_newmv_in_drl == 3 ? (psme + (psme >> 2)) : psme;
      if (cpi->sf.inter_sf.skip_newmv_in_drl >= 3 &&
          mode_info[ref_mv_idx].full_mv_bestsme > thr &&
          mode_info[prev_ref_idx].drl_cost < mode_info[ref_mv_idx].drl_cost) {
        best_mv->as_int = INVALID_MV;
        return;
      }
    }
  }

  if (cpi->common.features.cur_frame_force_integer_mv) {
    convert_fullmv_to_mv(best_mv);
  }

  const int use_fractional_mv =
      bestsme < INT_MAX && cpi->common.features.cur_frame_force_integer_mv == 0;
  int best_mv_rate = 0;
  int mv_rate_calculated = 0;
  if (use_fractional_mv) {
    int_mv fractional_ms_list[3];
    av1_set_fractional_mv(fractional_ms_list);
    int dis; /* TODO: use dis in distortion calculation later. */

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    MV subpel_start_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    switch (mbmi->motion_mode) {
      case SIMPLE_TRANSLATION:
        if (mv_sf->use_accurate_subpel_search) {
          const int try_second = second_best_mv.as_int != INVALID_MV &&
                                 second_best_mv.as_int != best_mv->as_int &&
                                 (mv_sf->disable_second_mv <= 1);
          const int best_mv_var = mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], fractional_ms_list);

          if (try_second) {
            struct macroblockd_plane *p = xd->plane;
            const BUFFER_SET orig_dst = {
              { p[0].dst.buf, p[1].dst.buf, p[2].dst.buf },
              { p[0].dst.stride, p[1].dst.stride, p[2].dst.stride },
            };
            int64_t rd = INT64_MAX;
            if (!mv_sf->disable_second_mv) {
              // Calculate actual rd cost.
              mbmi->mv[0].as_mv = best_mv->as_mv;
              av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                            bsize, 0, 0);
              av1_subtract_plane(x, bsize, 0);
              RD_STATS this_rd_stats;
              av1_init_rd_stats(&this_rd_stats);
              av1_estimate_txfm_yrd(cpi, x, &this_rd_stats, INT64_MAX, bsize,
                                    max_txsize_rect_lookup[bsize]);
              int this_mv_rate = av1_mv_bit_cost(
                  &best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                  mv_costs->mv_cost_stack, MV_COST_WEIGHT);
              rd = RDCOST(x->rdmult, this_mv_rate + this_rd_stats.rate,
                          this_rd_stats.dist);
            }

            MV this_best_mv;
            subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
            if (av1_is_subpelmv_in_range(&ms_params.mv_limits,
                                         subpel_start_mv)) {
              unsigned int sse;
              const int this_var = mv_search_params->find_fractional_mv_step(
                  xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv,
                  &dis, &sse, fractional_ms_list);

              if (!mv_sf->disable_second_mv) {
                // If cpi->sf.mv_sf.disable_second_mv is 0, use actual rd cost
                // to choose the better MV.
                mbmi->mv[0].as_mv = this_best_mv;
                av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                              bsize, 0, 0);
                av1_subtract_plane(x, bsize, 0);
                RD_STATS tmp_rd_stats;
                av1_init_rd_stats(&tmp_rd_stats);
                av1_estimate_txfm_yrd(cpi, x, &tmp_rd_stats, INT64_MAX, bsize,
                                      max_txsize_rect_lookup[bsize]);
                int tmp_mv_rate = av1_mv_bit_cost(
                    &this_best_mv, &ref_mv, mv_costs->nmv_joint_cost,
                    mv_costs->mv_cost_stack, MV_COST_WEIGHT);
                int64_t tmp_rd =
                    RDCOST(x->rdmult, tmp_rd_stats.rate + tmp_mv_rate,
                           tmp_rd_stats.dist);
                if (tmp_rd < rd) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              } else {
                // If cpi->sf.mv_sf.disable_second_mv = 1, use var to decide the
                // best MV.
                if (this_var < best_mv_var) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              }
            }
          }
        } else {
          mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], NULL);
        }
        break;
      case OBMC_CAUSAL:
        av1_find_best_obmc_sub_pixel_tree_up(
            xd, cm, &ms_params, subpel_start_mv, NULL, &best_mv->as_mv, &dis,
            &x->pred_sse[ref], NULL);
        break;
      default: assert(0 && "Invalid motion mode!\n");
    }

    // Terminate search with the current ref_idx based on subpel mv and rate
    // cost.
    if (cpi->sf.inter_sf.skip_newmv_in_drl >= 1 && args != NULL &&
        mbmi->motion_mode == SIMPLE_TRANSLATION &&
        best_mv->as_int != INVALID_MV) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      best_mv_rate =
          av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                          mv_costs->mv_cost_stack, MV_COST_WEIGHT);
      mv_rate_calculated = 1;

      for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
        if (!args->single_newmv_valid[prev_ref_idx][ref]) continue;
        // Check if the motion vectors are the same.
        if (best_mv->as_int == args->single_newmv[prev_ref_idx][ref].as_int) {
          // Skip this evaluation if the previous one is skipped.
          if (mode_info[prev_ref_idx].skip) {
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
          // Compare the rate cost that we current know.
          const int prev_rate_cost =
              args->single_newmv_rate[prev_ref_idx][ref] +
              mode_info[prev_ref_idx].drl_cost;
          const int this_rate_cost =
              best_mv_rate + mode_info[ref_mv_idx].drl_cost;

          if (prev_rate_cost <= this_rate_cost) {
            // If the current rate_cost is worse than the previous rate_cost,
            // then we terminate the search for this ref_mv_idx.
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
        }
      }
    }
  }

  if (mv_rate_calculated) {
    *rate_mv = best_mv_rate;
  } else {
    *rate_mv =
        av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }
}